

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes
          (XmlUnitTestResultPrinter *this,TestResult *result)

{
  XmlUnitTestResultPrinter *pXVar1;
  TestProperty *pTVar2;
  Message *pMVar3;
  size_t extraout_RDX;
  int i;
  String SVar4;
  XmlUnitTestResultPrinter local_58;
  XmlUnitTestResultPrinter *local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message attributes;
  
  local_40 = this;
  Message::Message((Message *)&local_38);
  for (i = 0; pXVar1 = local_40,
      i < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5); i = i + 1) {
    pTVar2 = TestResult::GetTestProperty(result,i);
    pMVar3 = Message::operator<<((Message *)&local_38,(char (*) [2])0x130240);
    local_58.output_file_.length_ = (size_t)(pTVar2->key_).c_str_;
    pMVar3 = Message::operator<<(pMVar3,(char **)&local_58.output_file_.length_);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x130b35);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x130df9);
    EscapeXmlAttribute(&local_58,(pTVar2->value_).c_str_);
    pMVar3 = Message::operator<<(pMVar3,(String *)&local_58);
    Message::operator<<(pMVar3,(char (*) [2])0x130df9);
    String::~String((String *)&local_58);
  }
  StringStreamToString((internal *)local_40,local_38.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_38);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)pXVar1;
  return SVar4;
}

Assistant:

String XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}